

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpf_reader.cpp
# Opt level: O0

vector<Mirror,_std::allocator<Mirror>_> * __thiscall
RPF_reader::load_rpf_2
          (vector<Mirror,_std::allocator<Mirror>_> *__return_storage_ptr__,RPF_reader *this,
          string *file_to_read)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  istream *piVar4;
  undefined1 local_510 [8];
  Mirror incomming_mirror;
  string local_480 [3];
  bool displayed;
  int id;
  string keyword;
  stringstream local_460 [8];
  stringstream ss;
  ostream local_450 [376];
  undefined1 local_2d8 [8];
  Point_d sample_position;
  vector<Point_d,_std::allocator<Point_d>_> sampled_positions;
  Point_d displayed_sample;
  undefined1 auStack_270 [8];
  Point_d m_position;
  string local_248 [8];
  string line;
  long local_228;
  ifstream inFile;
  string *file_to_read_local;
  RPF_reader *this_local;
  vector<Mirror,_std::allocator<Mirror>_> *loadedMirrors;
  
  std::ifstream::ifstream(&local_228);
  std::__cxx11::string::string(local_248);
  m_position._31_1_ = 0;
  std::vector<Mirror,_std::allocator<Mirror>_>::vector(__return_storage_ptr__);
  Point_d::Point_d((Point_d *)auStack_270,999999.0,99999.0,99999.0,9999999);
  Point_d::Point_d((Point_d *)
                   &sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,999999.0,99999.0,99999.0,9999999);
  std::vector<Point_d,_std::allocator<Point_d>_>::vector
            ((vector<Point_d,_std::allocator<Point_d>_> *)&sample_position.id);
  Point_d::Point_d((Point_d *)local_2d8,999999.0,99999.0,99999.0,9999999);
  std::ifstream::open((string *)&local_228,(_Ios_Openmode)file_to_read);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Unable to open file ");
    std::operator<<(poVar3,(string *)file_to_read);
    exit(1);
  }
  while( true ) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_228,local_248);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::stringstream::stringstream(local_460);
    std::__cxx11::string::string(local_480);
    std::operator<<(local_450,local_248);
    std::operator>>((istream *)local_460,local_480);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_480,"id");
    if (bVar2) {
      std::istream::operator>>
                ((istream *)local_460,
                 (int *)((long)&incomming_mirror._disp_pixels.
                                super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage + 4));
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_480,"pos");
    if (bVar2) {
      std::istream::operator>>((istream *)local_460,(double *)auStack_270);
      std::istream::operator>>((istream *)local_460,&m_position.x);
      std::istream::operator>>((istream *)local_460,&m_position.y);
    }
    incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_480,"dis_sample");
    if (bVar2) {
      std::istream::operator>>
                ((istream *)local_460,
                 (double *)
                 &sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::istream::operator>>((istream *)local_460,&displayed_sample.x);
      std::istream::operator>>((istream *)local_460,&displayed_sample.y);
      if (((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_) == 99999.0) &&
         (!NAN((double)CONCAT44(displayed_sample.y._4_4_,displayed_sample.y._0_4_)))) {
        incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      }
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_480,"---");
    if (bVar2) {
      Mirror::Mirror((Mirror *)local_510);
      local_510._0_4_ =
           incomming_mirror._disp_pixels.super__Vector_base<Pixel_d,_std::allocator<Pixel_d>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      incomming_mirror._position._12_8_ = m_position._12_8_;
      incomming_mirror._0_8_ = auStack_270;
      incomming_mirror._64_8_ =
           sampled_positions.super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      std::vector<Mirror,_std::allocator<Mirror>_>::push_back
                (__return_storage_ptr__,(value_type *)local_510);
      Mirror::~Mirror((Mirror *)local_510);
    }
    std::__cxx11::string::~string(local_480);
    std::__cxx11::stringstream::~stringstream(local_460);
  }
  m_position._31_1_ = 1;
  std::vector<Point_d,_std::allocator<Point_d>_>::~vector
            ((vector<Point_d,_std::allocator<Point_d>_> *)&sample_position.id);
  if ((m_position._31_1_ & 1) == 0) {
    std::vector<Mirror,_std::allocator<Mirror>_>::~vector(__return_storage_ptr__);
  }
  std::__cxx11::string::~string(local_248);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Mirror> RPF_reader::load_rpf_2(std::string const& file_to_read){
    std::ifstream inFile;
    std::string line;
    std::vector<Mirror> loadedMirrors;
    Point_d m_position;
    Point_d displayed_sample;
    std::vector<Point_d> sampled_positions;
    Point_d sample_position;


    inFile.open(file_to_read);
    if (!inFile) {
        std::cerr << "Unable to open file "<<file_to_read;
        exit(1);   // call system to stop
    }
    else{
      while(std::getline(inFile, line)){

        std::stringstream ss;
        std::string keyword;


        //------------------------------------------------------
        //------------------------------------------------------
  /*
        int id;
        Point_d _position;
        std::vector<Point_d> _matching_samples;
        // value ammount of _matching_samples  not used???
        int _ammount_of_matching_samples = 0;
        Point_d _displayed_sample;
        bool has_sample = false;
        */
        //------------------------------------------------------
        //------------------------------------------------------

        ss << line;
        ss >> keyword;


        int id;

        if(keyword == "id"){
      //  std::cout <<"keyword: m_id " << '\n';
          ss >> id;

        }


        if(keyword == "pos"){
  //      std::cout <<"keyword: m_pos " << '\n';

          ss >> m_position.x;
          ss >> m_position.y;
          ss >> m_position.dis;

        }
//        std::cout <<"keyword: m_pos.y "<< m_position.y << '\n';


        bool displayed = true;

        if(keyword == "dis_sample"){
//          std::cout <<"keyword: displayed_sample " << '\n';

//          ss >> displayed_sample.id;
          ss >> displayed_sample.x;
          ss >> displayed_sample.y;
          ss >> displayed_sample.dis;
          if(displayed_sample.dis == 99999){
            displayed = false;
          }
        }
/*
        int sample_amount;

        if(keyword == "sample_amount"){
  //        std::cout <<"keyword: sample_ammount " << '\n';

          ss >> sample_amount;
        }

        if(keyword == "pos"){
    //      std::cout <<"keyword: pos " << '\n';


          ss >> sample_position.id;
          ss >> sample_position.x;
          ss >> sample_position.y;
          ss >> sample_position.dis;

          sampled_positions.push_back(sample_position);

        }
*/
        if(keyword == "---"){
    //      std::cout <<"keyword: --- " << '\n';

          Mirror incomming_mirror;

          incomming_mirror.id = id;
          incomming_mirror._position = m_position;
          incomming_mirror._displayed_sample = displayed_sample;
//          incomming_mirror._ammount_of_matching_samples = sample_amount;
//          incomming_mirror._matching_samples = sampled_positions;
//          incomming_mirror.has_sample = displayed;

          loadedMirrors.push_back(incomming_mirror);

        }
      }
    }
    return loadedMirrors;
  }